

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

void __thiscall
QtPrivate::QTypeNormalizer::normalizeIntegerTypes(QTypeNormalizer *this,char **begin,char *end)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int local_38;
  int local_34;
  
  iVar8 = 0;
  iVar7 = 0;
  iVar6 = 0;
  local_38 = 0;
  local_34 = 0;
  iVar5 = 0;
  if (*begin < end) {
    iVar5 = 0;
    local_34 = 0;
    local_38 = 0;
    iVar6 = 0;
    iVar7 = 0;
    iVar8 = 0;
LAB_00289e44:
    do {
      bVar2 = skipToken(begin,end,"long",false);
      if (bVar2) {
        iVar8 = iVar8 + 1;
        pcVar1 = *begin;
      }
      else {
        bVar2 = skipToken(begin,end,"int",false);
        if (bVar2) {
          local_38 = local_38 + 1;
        }
        else {
          bVar2 = skipToken(begin,end,"short",false);
          if (bVar2) {
            local_34 = local_34 + 1;
          }
          else {
            bVar2 = skipToken(begin,end,"unsigned",false);
            if (bVar2) {
              iVar6 = iVar6 + 1;
              pcVar1 = *begin;
              goto joined_r0x00289ef4;
            }
            bVar2 = skipToken(begin,end,"signed",false);
            if (bVar2) {
              iVar7 = iVar7 + 1;
              if (end <= *begin) break;
              goto LAB_00289e44;
            }
            bVar2 = skipToken(begin,end,"char",false);
            if (!bVar2) break;
            iVar5 = iVar5 + 1;
          }
        }
        pcVar1 = *begin;
      }
joined_r0x00289ef4:
    } while (pcVar1 < end);
  }
  if (iVar8 == 2) {
    this->last = 'q';
    this->len = this->len + 1;
    pcVar1 = this->output;
    if (pcVar1 != (char *)0x0) {
      this->output = pcVar1 + 1;
      *pcVar1 = 'q';
    }
  }
  if ((iVar7 == 0) || (iVar5 == 0)) {
    if (iVar6 != 0) {
      this->last = 'u';
      this->len = this->len + 1;
      pcVar1 = this->output;
      if (pcVar1 != (char *)0x0) {
        this->output = pcVar1 + 1;
        *pcVar1 = 'u';
      }
    }
  }
  else {
    cVar4 = 's';
    lVar3 = 1;
    do {
      this->last = cVar4;
      this->len = this->len + 1;
      pcVar1 = this->output;
      if (pcVar1 != (char *)0x0) {
        this->output = pcVar1 + 1;
        *pcVar1 = cVar4;
      }
      cVar4 = "signed "[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
  }
  if (iVar5 == 0) {
    if (local_34 == 0) {
      if (iVar8 == 1) {
        cVar4 = 'l';
        lVar3 = 0;
        do {
          this->last = cVar4;
          this->len = this->len + 1;
          pcVar1 = this->output;
          if (pcVar1 != (char *)0x0) {
            this->output = pcVar1 + 1;
            *pcVar1 = cVar4;
          }
          cVar4 = "unsigned long"[lVar3 + 10];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
      }
      else if (iVar8 == 2) {
        cVar4 = 'l';
        lVar3 = 0;
        do {
          this->last = cVar4;
          this->len = this->len + 1;
          pcVar1 = this->output;
          if (pcVar1 != (char *)0x0) {
            this->output = pcVar1 + 1;
            *pcVar1 = cVar4;
          }
          cVar4 = "qlonglong"[lVar3 + 2];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 8);
      }
      else if ((iVar6 != 0 || iVar7 != 0) || local_38 != 0) {
        cVar4 = 'i';
        lVar3 = 1;
        do {
          this->last = cVar4;
          this->len = this->len + 1;
          pcVar1 = this->output;
          if (pcVar1 != (char *)0x0) {
            this->output = pcVar1 + 1;
            *pcVar1 = cVar4;
          }
          cVar4 = "unsigned int"[lVar3 + 9];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
      }
    }
    else {
      cVar4 = 's';
      lVar3 = 1;
      do {
        this->last = cVar4;
        this->len = this->len + 1;
        pcVar1 = this->output;
        if (pcVar1 != (char *)0x0) {
          this->output = pcVar1 + 1;
          *pcVar1 = cVar4;
        }
        cVar4 = "unsigned short"[lVar3 + 9];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 6);
    }
  }
  else {
    cVar4 = 'c';
    lVar3 = 0;
    do {
      this->last = cVar4;
      this->len = this->len + 1;
      pcVar1 = this->output;
      if (pcVar1 != (char *)0x0) {
        this->output = pcVar1 + 1;
        *pcVar1 = cVar4;
      }
      cVar4 = "unsigned char"[lVar3 + 10];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
  }
  return;
}

Assistant:

constexpr void normalizeIntegerTypes(const char *&begin, const char *end)
    {
        int numLong = 0;
        int numSigned = 0;
        int numUnsigned = 0;
        int numInt = 0;
        int numShort = 0;
        int numChar = 0;
        while (begin < end) {
            if (skipToken(begin, end, "long")) {
                numLong++;
                continue;
            }
            if (skipToken(begin, end, "int")) {
                numInt++;
                continue;
            }
            if (skipToken(begin, end, "short")) {
                numShort++;
                continue;
            }
            if (skipToken(begin, end, "unsigned")) {
                numUnsigned++;
                continue;
            }
            if (skipToken(begin, end, "signed")) {
                numSigned++;
                continue;
            }
            if (skipToken(begin, end, "char")) {
                numChar++;
                continue;
            }
#ifdef Q_CC_MSVC
            if (skipToken(begin, end, "__int64")) {
                numLong = 2;
                continue;
            }
#endif
            break;
        }
        if (numLong == 2)
            append('q'); // q(u)longlong
        if (numSigned && numChar)
            appendStr("signed ");
        else if (numUnsigned)
            appendStr("u");
        if (numChar)
            appendStr("char");
        else if (numShort)
            appendStr("short");
        else if (numLong == 1)
            appendStr("long");
        else if (numLong == 2)
            appendStr("longlong");
        else if (numUnsigned || numSigned || numInt)
            appendStr("int");
    }